

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parse.h
# Opt level: O1

void Parser::MapBindIdentifierFromElement<PreVisitCatch(ParseNodeCatch*,ByteCodeGenerator*)::__0>
               (ParseNodePtr elementNode,anon_class_8_1_ae4198de handler)

{
  undefined1 *puVar1;
  OpCode OVar2;
  Symbol *this;
  IdentPtr pIVar3;
  code *pcVar4;
  bool bVar5;
  ParseNodeBin *pPVar6;
  ParseNodeVar *pPVar7;
  char16 *pcVar8;
  undefined4 *puVar9;
  
  if (elementNode->nop == knopEllipsis) {
    pPVar6 = (ParseNodeBin *)ParseNode::AsParseNodeUni(elementNode);
  }
  else {
    if (elementNode->nop != knopAsg) goto LAB_00839b0d;
    pPVar6 = ParseNode::AsParseNodeBin(elementNode);
  }
  elementNode = pPVar6->pnode1;
LAB_00839b0d:
  OVar2 = elementNode->nop;
  if ((OVar2 & ~knopInt) == knopObjectPattern) {
    MapBindIdentifier<PreVisitCatch(ParseNodeCatch*,ByteCodeGenerator*)::__0>(elementNode,handler);
    return;
  }
  if ((byte)(OVar2 + ~knopList) < 3) {
    pPVar7 = ParseNode::AsParseNodeVar(elementNode);
    this = pPVar7->sym;
    bVar5 = Js::Phases::IsEnabled((Phases *)&DAT_015cd718,ByteCodePhase);
    if (bVar5) {
      pPVar7 = ParseNode::AsParseNodeVar(elementNode);
      pIVar3 = pPVar7->pid;
      pcVar8 = Symbol::GetSymbolTypeName(this);
      Output::Print(L"current context has declared catch var %s of type %s\n",&pIVar3->field_0x22,
                    pcVar8);
    }
    puVar1 = &this->field_0x42;
    *puVar1 = *puVar1 | 0x42;
  }
  else if (OVar2 != knopEmpty) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar9 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/../Parser/Parse.h"
                       ,0x2dc,"(bindIdentNode->nop == knopEmpty)","Invalid bind identifier");
    if (!bVar5) {
      pcVar4 = (code *)invalidInstructionException();
      (*pcVar4)();
    }
    *puVar9 = 0;
  }
  return;
}

Assistant:

static void MapBindIdentifierFromElement(ParseNodePtr elementNode, THandler handler)
    {
        ParseNodePtr bindIdentNode = elementNode;
        if (bindIdentNode->nop == knopAsg)
        {
            bindIdentNode = bindIdentNode->AsParseNodeBin()->pnode1;
        }
        else if (bindIdentNode->nop == knopEllipsis)
        {
            bindIdentNode = bindIdentNode->AsParseNodeUni()->pnode1;
        }

        if (bindIdentNode->IsPattern())
        {
            MapBindIdentifier(bindIdentNode, handler);
        }
        else if (bindIdentNode->IsVarLetOrConst())
        {
            handler(bindIdentNode);
        }
        else
        {
            AssertMsg(bindIdentNode->nop == knopEmpty, "Invalid bind identifier");
        }
    }